

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

uint64_t create_indent(int level,uint64_t old_indent,lys_node *node,int shorthand,
                      lys_module *sub_module,lys_node *aug_parent)

{
  int iVar1;
  LY_ERR *pLVar2;
  lys_node *plVar3;
  uint64_t uVar4;
  bool bVar6;
  ulong uVar5;
  
  if (level < 0x41) {
    bVar6 = false;
    if ((shorthand == 0) && (bVar6 = false, node->nodetype != LYS_CASE)) {
      plVar3 = lys_parent(node);
      if ((plVar3 == (lys_node *)0x0) ||
         (((plVar3 = lys_parent(node), (plVar3->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN ||
           (node->next == (lys_node *)0x0)) ||
          (plVar3 = lys_parent(node->next), plVar3 == (lys_node *)0x0)))) {
        bVar6 = false;
      }
      else {
        plVar3 = lys_parent(node->next);
        bVar6 = plVar3->nodetype == LYS_CHOICE;
      }
    }
    iVar1 = sibling_is_valid_child(node,0,sub_module,aug_parent,node->nodetype);
    uVar5 = 1L << ((char)level - 1U & 0x3f);
    if (iVar1 == 0) {
      uVar5 = 0;
    }
    if (bVar6) {
      uVar5 = 0;
    }
    uVar4 = uVar5 | old_indent;
  }
  else {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINT;
    uVar4 = 0;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_tree.c"
           ,0x82);
  }
  return uVar4;
}

Assistant:

uint64_t
create_indent(int level, uint64_t old_indent, const struct lys_node *node, int shorthand,
              const struct lys_module *sub_module, struct lys_node *aug_parent)
{
    uint64_t new_indent;
    int next_is_case = 0, is_case = 0, has_next = 0;

    if (level > 64) {
        LOGINT;
        return 0;
    }

    new_indent = old_indent;

    /* this is the indent of a case (standard or shorthand) */
    if ((node->nodetype == LYS_CASE) || shorthand) {
        is_case = 1;
    }

    /* this is the direct child of a case */
    if (!is_case && lys_parent(node) && (lys_parent(node)->nodetype & (LYS_CASE | LYS_CHOICE))) {
        /* it is not the only child */
        if (node->next && lys_parent(node->next) && (lys_parent(node->next)->nodetype == LYS_CHOICE)) {
            next_is_case = 1;
        }
    }

    /* next is a node that will actually be printed */
    has_next = sibling_is_valid_child(node, 0, sub_module, aug_parent, node->nodetype);

    if (has_next && !next_is_case) {
        new_indent |= (uint64_t)1 << (level - 1);
    }

    return new_indent;
}